

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void retn_(PDISASM pMyDisasm)

{
  UIntPtr UVar1;
  int iVar2;
  
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 0xd;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"retn",5);
  iVar2 = Security(3,pMyDisasm);
  if (iVar2 != 0) {
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand1).OpMnemonic,"%.4X",
                        (ulong)*(ushort *)((pMyDisasm->Reserved_).EIP_ + 1));
    (pMyDisasm->Reserved_).ImmediatSize = 0x10;
    UVar1 = (pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Instruction).Immediat = (ulong)*(ushort *)(UVar1 + 1);
    (pMyDisasm->Reserved_).EIP_ = UVar1 + 3;
    (pMyDisasm->Operand1).OpType = 0x8040000;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand1).AccessMode = 1;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x21;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 0x10;
    (pMyDisasm->Instruction).ImplicitModifiedRegs.special = 1;
  }
  return;
}

Assistant:

void __bea_callspec__ retn_(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = RetType;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "retn");
    #endif
    if (!Security(3, pMyDisasm)) return;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand1.OpMnemonic,"%.4X",(Int64)*((UInt16*) (GV.EIP_+1)));
    #endif
    GV.ImmediatSize = 16;
    pMyDisasm->Instruction.Immediat = *((UInt16*) (GV.EIP_+1));
    GV.EIP_+=3;
    pMyDisasm->Operand1.OpType = CONSTANT_TYPE+ABSOLUTE_;
    pMyDisasm->Operand1.OpSize = 16;
    pMyDisasm->Operand1.AccessMode = READ;
    pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG + SPECIAL_REG;
    pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG4;
    pMyDisasm->Instruction.ImplicitModifiedRegs.special = REG0;
}